

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SetQueue.h
# Opt level: O0

void __thiscall
dg::ADT::SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_>::push
          (SetQueue<dg::ADT::QueueFIFO<const_llvm::Function_*>_> *this,ValueType *what)

{
  set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
  *in_RSI;
  Function **in_RDI;
  pair<std::_Rb_tree_const_iterator<const_llvm::Function_*>,_bool> pVar1;
  undefined1 in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  
  pVar1 = std::
          set<const_llvm::Function_*,_std::less<const_llvm::Function_*>,_std::allocator<const_llvm::Function_*>_>
          ::insert(in_RSI,(value_type *)
                          CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8));
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    QueueFIFO<const_llvm::Function_*>::push
              ((QueueFIFO<const_llvm::Function_*> *)pVar1.first._M_node._M_node,in_RDI);
  }
  return;
}

Assistant:

void push(const ValueType &what) {
        if (_queued.insert(what).second)
            _queue.push(what);
    }